

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPU4StateImpl<float,_1,_0>::calcPartialsPartials
          (BeagleCPU4StateImpl<float,_1,_0> *this,float *destP,float *partials1,float *matrices1,
          float *partials2,float *matrices2,int startPattern,int endPattern)

{
  float *pfVar1;
  undefined4 uVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int k;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  uint uVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  
  auVar4 = vpmovsxbq_avx(ZEXT216(0xa05));
  auVar5 = vpmovsxbq_avx2(ZEXT416(0x100b0601));
  auVar6 = vpmovsxbq_avx2(ZEXT416(0x110c0702));
  auVar7 = vpmovsxbq_avx2(ZEXT416(0x120d0803));
  uVar3 = (this->super_BeagleCPUImpl<float,_1,_0>).kCategoryCount;
  uVar17 = (ulong)(uint)startPattern;
  iVar16 = startPattern * 4;
  uVar18 = (this->super_BeagleCPUImpl<float,_1,_0>).kPaddedPatternCount * 4;
  for (uVar20 = 0; uVar20 != (~((int)uVar3 >> 0x1f) & uVar3); uVar20 = uVar20 + 1) {
    lVar21 = (long)iVar16 << 2;
    auVar32 = vpbroadcastq_avx512vl();
    lVar19 = uVar20 * 0x14 + 0xf;
    auVar22 = vpaddq_avx(auVar32._0_16_,auVar4);
    auVar33 = vpbroadcastq_avx512vl();
    vpaddq_avx2(auVar32,auVar5);
    vpaddq_avx2(auVar32,auVar6);
    vpaddq_avx2(auVar32,auVar7);
    auVar8 = vpermq_avx2(ZEXT1632(auVar22),0xd0);
    auVar8 = vpblendd_avx2(auVar8,auVar32,3);
    vpblendd_avx2(auVar8,auVar33,0xc0);
    auVar22 = vgatherqps_avx512vl(*(undefined8 *)(matrices1 + (long)matrices2));
    auVar23 = vgatherqps_avx512vl(*(undefined8 *)(matrices1 + uVar17));
    auVar24 = vgatherqps_avx512vl(*(undefined8 *)(matrices1 + uVar18));
    auVar25 = vgatherqps_avx512vl(*(undefined8 *)(matrices1 + lVar19));
    auVar26 = vgatherqps_avx512vl(*(undefined8 *)((long)matrices2 * 5));
    auVar27 = vgatherqps_avx512vl(*(undefined8 *)(matrices2 + uVar17));
    auVar28 = vgatherqps_avx512vl(*(undefined8 *)(matrices2 + uVar18));
    auVar29 = vgatherqps_avx512vl(*(undefined8 *)(matrices2 + lVar19));
    uVar15 = uVar17;
    while ((int)uVar15 < endPattern) {
      uVar2 = *(undefined4 *)((long)partials1 + lVar21 + 4);
      auVar30._4_4_ = uVar2;
      auVar30._0_4_ = uVar2;
      auVar30._8_4_ = uVar2;
      auVar30._12_4_ = uVar2;
      auVar30 = vmulps_avx512vl(auVar23,auVar30);
      uVar2 = *(undefined4 *)((long)partials2 + lVar21 + 4);
      auVar31._4_4_ = uVar2;
      auVar31._0_4_ = uVar2;
      auVar31._8_4_ = uVar2;
      auVar31._12_4_ = uVar2;
      auVar31 = vmulps_avx512vl(auVar27,auVar31);
      uVar15 = (ulong)((int)uVar15 + 1);
      uVar2 = *(undefined4 *)((long)partials1 + lVar21);
      auVar9._4_4_ = uVar2;
      auVar9._0_4_ = uVar2;
      auVar9._8_4_ = uVar2;
      auVar9._12_4_ = uVar2;
      auVar30 = vfmadd231ps_avx512vl(auVar30,auVar22,auVar9);
      uVar2 = *(undefined4 *)((long)partials2 + lVar21);
      auVar10._4_4_ = uVar2;
      auVar10._0_4_ = uVar2;
      auVar10._8_4_ = uVar2;
      auVar10._12_4_ = uVar2;
      auVar31 = vfmadd231ps_avx512vl(auVar31,auVar26,auVar10);
      uVar2 = *(undefined4 *)((long)partials1 + lVar21 + 8);
      auVar11._4_4_ = uVar2;
      auVar11._0_4_ = uVar2;
      auVar11._8_4_ = uVar2;
      auVar11._12_4_ = uVar2;
      auVar30 = vfmadd231ps_avx512vl(auVar30,auVar24,auVar11);
      uVar2 = *(undefined4 *)((long)partials2 + lVar21 + 8);
      auVar12._4_4_ = uVar2;
      auVar12._0_4_ = uVar2;
      auVar12._8_4_ = uVar2;
      auVar12._12_4_ = uVar2;
      auVar31 = vfmadd231ps_avx512vl(auVar31,auVar28,auVar12);
      uVar2 = *(undefined4 *)((long)partials1 + lVar21 + 0xc);
      auVar13._4_4_ = uVar2;
      auVar13._0_4_ = uVar2;
      auVar13._8_4_ = uVar2;
      auVar13._12_4_ = uVar2;
      auVar30 = vfmadd231ps_avx512vl(auVar30,auVar25,auVar13);
      uVar2 = *(undefined4 *)((long)partials2 + lVar21 + 0xc);
      auVar14._4_4_ = uVar2;
      auVar14._0_4_ = uVar2;
      auVar14._8_4_ = uVar2;
      auVar14._12_4_ = uVar2;
      auVar31 = vfmadd231ps_avx512vl(auVar31,auVar29,auVar14);
      pfVar1 = (float *)((long)destP + lVar21);
      *pfVar1 = auVar30._0_4_ * auVar31._0_4_;
      pfVar1[1] = auVar30._4_4_ * auVar31._4_4_;
      pfVar1[2] = auVar30._8_4_ * auVar31._8_4_;
      pfVar1[3] = auVar30._12_4_ * auVar31._12_4_;
      lVar21 = lVar21 + 0x10;
    }
    iVar16 = iVar16 + uVar18;
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::calcPartialsPartials(REALTYPE* destP,
                                                                   const REALTYPE* partials1,
                                                                   const REALTYPE* matrices1,
                                                                   const REALTYPE* partials2,
                                                                   const REALTYPE* matrices2,
                                                                   int startPattern,
                                                                   int endPattern) {


#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int u = l*4*kPaddedPatternCount;
        if (startPattern != 0) {
          u += 4*startPattern;
        }
        int w = l*4*OFFSET;

        PREFETCH_MATRIX(1,matrices1,w);
        PREFETCH_MATRIX(2,matrices2,w);
        for (int k = startPattern; k < endPattern; k++) {
            PREFETCH_PARTIALS(1,partials1,u);
            PREFETCH_PARTIALS(2,partials2,u);

            DO_INTEGRATION(1); // defines sum10, sum11, sum12, sum13
            DO_INTEGRATION(2); // defines sum20, sum21, sum22, sum23

            // Final results
            destP[u    ] = sum10 * sum20;
            destP[u + 1] = sum11 * sum21;
            destP[u + 2] = sum12 * sum22;
            destP[u + 3] = sum13 * sum23;

            u += 4;

        }
    }
}